

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_tess_level_input
          (CompilerMSL *this,string *base_ref,string *mbr_name,SPIRVariable *var)

{
  code *pcVar1;
  undefined1 *puVar2;
  undefined8 uVar3;
  code cVar4;
  uint32_t uVar5;
  SPIRFunction *this_00;
  _func_void *p_Var6;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  CompilerMSL *local_c0;
  CompilerMSL *pCStack_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [16];
  pointer local_98;
  string local_90 [24];
  string local_78 [8];
  string local_70 [24];
  undefined1 local_58;
  string var_name;
  
  this_00 = Compiler::get<spirv_cross::SPIRFunction>
                      ((Compiler *)this,
                       (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  uVar5 = Compiler::get_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(&var_name,this,(ulong)uVar5,7);
  Compiler::set_name((Compiler *)this,(ID)(var->super_IVariant).self.id,&var_name);
  SPIRFunction::add_local_variable(this_00,(VariableID)(var->super_IVariant).self.id);
  local_c0 = (CompilerMSL *)CONCAT44(local_c0._4_4_,(var->super_IVariant).self.id);
  SmallVector<unsigned_int,_8UL>::push_back(&this->vars_needing_early_declaration,(uint *)&local_c0)
  ;
  cVar4 = (code)Compiler::is_tessellating_triangles((Compiler *)this);
  if (uVar5 == 0xb) {
    local_c0 = this;
    ::std::__cxx11::string::string((string *)&pCStack_b8,(string *)&var_name);
    ::std::__cxx11::string::string((string *)&local_98,(string *)base_ref);
    ::std::__cxx11::string::string(local_78,(string *)mbr_name);
    local_e8._M_unused._M_object = (void *)0x0;
    local_e8._8_8_ = 0;
    local_d8 = (code *)0x0;
    pcStack_d0 = (code *)0x0;
    local_58 = cVar4;
    p_Var6 = (_func_void *)operator_new(0x70);
    puVar2 = local_b0;
    *(CompilerMSL **)p_Var6 = local_c0;
    pcVar1 = p_Var6 + 0x18;
    *(code **)(p_Var6 + 8) = pcVar1;
    if (pCStack_b8 == (CompilerMSL *)local_a8) {
      *(undefined8 *)pcVar1 = local_a8._0_8_;
      *(ulong *)(p_Var6 + 0x20) = CONCAT71(local_a8._9_7_,local_a8[8]);
    }
    else {
      *(CompilerMSL **)(p_Var6 + 8) = pCStack_b8;
      *(undefined8 *)pcVar1 = local_a8._0_8_;
    }
    local_b0 = (undefined1 *)0x0;
    *(undefined1 **)(p_Var6 + 0x10) = puVar2;
    local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
    pCStack_b8 = (CompilerMSL *)local_a8;
    ::std::__cxx11::string::string((string *)(p_Var6 + 0x28),(string *)&local_98);
    ::std::__cxx11::string::string((string *)(p_Var6 + 0x48),local_78);
    p_Var6[0x68] = local_58;
    pcStack_d0 = ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:3329:7)>
                 ::_M_invoke;
    local_d8 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:3329:7)>
               ::_M_manager;
    local_e8._M_unused._M_function_pointer = p_Var6;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&this_00->fixup_hooks_in,(function<void_()> *)&local_e8);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_e8);
    add_tess_level_input(std::__cxx11::string_const&,std::__cxx11::string_const&,spirv_cross::SPIRVariable&)
    ::$_0::~__0((__0 *)&local_c0);
  }
  else {
    local_c0 = (CompilerMSL *)CONCAT71(local_c0._1_7_,cVar4);
    pCStack_b8 = this;
    ::std::__cxx11::string::string((string *)&local_b0,(string *)&var_name);
    ::std::__cxx11::string::string(local_90,(string *)base_ref);
    ::std::__cxx11::string::string(local_70,(string *)mbr_name);
    local_d8 = (code *)0x0;
    pcStack_d0 = (code *)0x0;
    local_e8._M_unused._M_object = (void *)0x0;
    local_e8._8_8_ = 0;
    p_Var6 = (_func_void *)operator_new(0x70);
    uVar3 = local_a8._0_8_;
    *(CompilerMSL **)p_Var6 = local_c0;
    *(CompilerMSL **)(p_Var6 + 8) = pCStack_b8;
    pcVar1 = p_Var6 + 0x20;
    *(code **)(p_Var6 + 0x10) = pcVar1;
    if (local_b0 == local_a8 + 8) {
      *(ulong *)pcVar1 = CONCAT71(local_a8._9_7_,local_a8[8]);
      *(pointer *)(p_Var6 + 0x28) = local_98;
    }
    else {
      *(undefined1 **)(p_Var6 + 0x10) = local_b0;
      *(ulong *)pcVar1 = CONCAT71(local_a8._9_7_,local_a8[8]);
    }
    local_a8._0_8_ = (_func_int **)0x0;
    *(undefined8 *)(p_Var6 + 0x18) = uVar3;
    local_a8[8] = 0;
    local_b0 = local_a8 + 8;
    ::std::__cxx11::string::string((string *)(p_Var6 + 0x30),local_90);
    ::std::__cxx11::string::string((string *)(p_Var6 + 0x50),local_70);
    pcStack_d0 = ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:3340:39)>
                 ::_M_invoke;
    local_d8 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:3340:39)>
               ::_M_manager;
    local_e8._M_unused._0_8_ = (undefined8)p_Var6;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&this_00->fixup_hooks_in,(function<void_()> *)&local_e8);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_e8);
    add_tess_level_input(std::__cxx11::string_const&,std::__cxx11::string_const&,spirv_cross::SPIRVariable&)
    ::$_1::~__1((__1 *)&local_c0);
  }
  ::std::__cxx11::string::~string((string *)&var_name);
  return;
}

Assistant:

void CompilerMSL::add_tess_level_input(const std::string &base_ref, const std::string &mbr_name, SPIRVariable &var)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));

	// Force the variable to have the proper name.
	string var_name = builtin_to_glsl(builtin, StorageClassFunction);
	set_name(var.self, var_name);

	// We need to declare the variable early and at entry-point scope.
	entry_func.add_local_variable(var.self);
	vars_needing_early_declaration.push_back(var.self);
	bool triangles = is_tessellating_triangles();

	if (builtin == BuiltInTessLevelOuter)
	{
		entry_func.fixup_hooks_in.push_back(
		    [=]()
		    {
			    statement(var_name, "[0] = ", base_ref, ".", mbr_name, "[0];");
			    statement(var_name, "[1] = ", base_ref, ".", mbr_name, "[1];");
			    statement(var_name, "[2] = ", base_ref, ".", mbr_name, "[2];");
			    if (!triangles)
				    statement(var_name, "[3] = ", base_ref, ".", mbr_name, "[3];");
		    });
	}
	else
	{
		entry_func.fixup_hooks_in.push_back([=]() {
			if (triangles)
			{
				if (msl_options.raw_buffer_tese_input)
					statement(var_name, "[0] = ", base_ref, ".", mbr_name, ";");
				else
					statement(var_name, "[0] = ", base_ref, ".", mbr_name, "[3];");
			}
			else
			{
				statement(var_name, "[0] = ", base_ref, ".", mbr_name, "[0];");
				statement(var_name, "[1] = ", base_ref, ".", mbr_name, "[1];");
			}
		});
	}
}